

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprk.c
# Opt level: O1

ARKodeSPRKTable ARKodeSPRKTable_Copy(ARKodeSPRKTable that_sprk_table)

{
  int iVar1;
  sunrealtype *psVar2;
  sunrealtype *psVar3;
  sunrealtype *psVar4;
  sunrealtype *psVar5;
  ARKodeSPRKTable pAVar6;
  long lVar7;
  
  pAVar6 = ARKodeSPRKTable_Alloc(that_sprk_table->stages);
  pAVar6->q = that_sprk_table->q;
  iVar1 = pAVar6->stages;
  if (0 < (long)iVar1) {
    psVar2 = that_sprk_table->a;
    psVar3 = that_sprk_table->ahat;
    psVar4 = pAVar6->a;
    psVar5 = pAVar6->ahat;
    lVar7 = 0;
    do {
      psVar5[lVar7] = psVar3[lVar7];
      psVar4[lVar7] = psVar2[lVar7];
      lVar7 = lVar7 + 1;
    } while (iVar1 != lVar7);
  }
  return pAVar6;
}

Assistant:

ARKodeSPRKTable ARKodeSPRKTable_Copy(ARKodeSPRKTable that_sprk_table)
{
  int i                      = 0;
  ARKodeSPRKTable sprk_table = NULL;

  sprk_table = ARKodeSPRKTable_Alloc(that_sprk_table->stages);

  sprk_table->q = that_sprk_table->q;

  for (i = 0; i < sprk_table->stages; ++i)
  {
    sprk_table->ahat[i] = that_sprk_table->ahat[i];
    sprk_table->a[i]    = that_sprk_table->a[i];
  }

  return sprk_table;
}